

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

Result wabt::WriteBinarySpecScript
                 (Stream *json_stream,WriteBinarySpecStreamFactory *module_stream_factory,
                 Script *script,string_view source_filename,string_view module_filename_noext,
                 WriteBinaryOptions *options)

{
  _Manager_type p_Var1;
  string_view module_filename_noext_00;
  Result RVar2;
  _Any_data local_d8;
  _Manager_type local_c8;
  _Invoker_type p_Stack_c0;
  BinaryWriterSpec binary_writer_spec;
  
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (_Manager_type)0x0;
  p_Stack_c0 = (_Invoker_type)0x0;
  p_Var1 = (module_stream_factory->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_d8,(_Any_data *)module_stream_factory,__clone_functor);
    local_c8 = (module_stream_factory->super__Function_base)._M_manager;
    p_Stack_c0 = module_stream_factory->_M_invoker;
  }
  module_filename_noext_00._M_str = (char *)options;
  module_filename_noext_00._M_len = (size_t)module_filename_noext._M_str;
  anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
            (&binary_writer_spec,json_stream,(WriteBinarySpecStreamFactory *)&local_d8,
             source_filename,module_filename_noext_00,
             (WriteBinaryOptions *)module_filename_noext._M_len);
  if (local_c8 != (_Manager_type)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  RVar2 = anon_unknown_1::BinaryWriterSpec::WriteScript(&binary_writer_spec,script);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)binary_writer_spec.module_filename_noext_._M_dataplus._M_p !=
      &binary_writer_spec.module_filename_noext_.field_2) {
    operator_delete(binary_writer_spec.module_filename_noext_._M_dataplus._M_p,
                    binary_writer_spec.module_filename_noext_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)binary_writer_spec.source_filename_._M_dataplus._M_p !=
      &binary_writer_spec.source_filename_.field_2) {
    operator_delete(binary_writer_spec.source_filename_._M_dataplus._M_p,
                    binary_writer_spec.source_filename_.field_2._M_allocated_capacity + 1);
  }
  if (binary_writer_spec.module_stream_factory_.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    (*binary_writer_spec.module_stream_factory_.super__Function_base._M_manager)
              ((_Any_data *)&binary_writer_spec.module_stream_factory_,
               (_Any_data *)&binary_writer_spec.module_stream_factory_,__destroy_functor);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result WriteBinarySpecScript(Stream* json_stream,
                             WriteBinarySpecStreamFactory module_stream_factory,
                             Script* script,
                             std::string_view source_filename,
                             std::string_view module_filename_noext,
                             const WriteBinaryOptions& options) {
  BinaryWriterSpec binary_writer_spec(json_stream, module_stream_factory,
                                      source_filename, module_filename_noext,
                                      options);
  return binary_writer_spec.WriteScript(*script);
}